

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O3

void __thiscall JsonObject_MisplacedComma_Test::TestBody(JsonObject_MisplacedComma_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  parser<pstore::json::null_output> *ppVar2;
  char *pcVar3;
  parser<pstore::json::null_output> p1;
  coord local_f8;
  error_code local_f0;
  error_category *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  undefined5 local_d0;
  undefined1 uStack_cb;
  undefined2 uStack_ca;
  undefined1 local_c8;
  undefined4 uStack_c7;
  undefined1 local_c3;
  undefined1 local_c2;
  parser<pstore::json::null_output> local_c0;
  
  pstore::json::parser<pstore::json::null_output>::parser(&local_c0,0);
  local_d0 = 0x3a2261227b;
  uStack_cb = 0x31;
  uStack_ca = 0x7d2c;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000008;
  local_c8 = 0;
  local_e0 = (error_category *)&local_d0;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_f0,8);
  local_f0._M_cat = (error_category *)&local_d0;
  ppVar2 = pstore::json::parser<pstore::json::null_output>::input<pstore::gsl::span<char_const,_1l>>
                     (&local_c0,(span<const_char,__1L> *)&local_f0);
  pstore::json::parser<pstore::json::null_output>::eof(ppVar2);
  if (local_e0 != (error_category *)&local_d0) {
    operator_delete(local_e0,CONCAT26(uStack_ca,CONCAT15(uStack_cb,local_d0)) + 1);
  }
  local_f0._M_cat = pstore::json::get_error_category();
  local_f0._M_value = 8;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_e0,"p1.last_error ()",
             "make_error_code (json::error_code::expected_token)",&local_c0.error_,&local_f0);
  if (local_e0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x90,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((long *)local_f0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0._0_8_ + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  local_f0._M_value = local_c0.coordinate_.column;
  local_f0._4_4_ = local_c0.coordinate_.row;
  local_f8.column = 8;
  local_f8.row = 1;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)&local_e0,"p1.coordinate ()","(json::coord{8U, 1U})",(coord *)&local_f0,
             &local_f8);
  if (local_e0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x91,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((coord)local_f0._0_8_ != (coord)0x0) {
      (**(code **)(*(long *)local_f0._0_8_ + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  paVar1 = &local_c0.string_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.string_._M_dataplus._M_p,
                    local_c0.string_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
  ::~deque(&local_c0.stack_.c);
  if (local_c0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
       )0x0) {
    operator_delete((void *)local_c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
                            ._M_head_impl,0x68);
  }
  pstore::json::parser<pstore::json::null_output>::parser(&local_c0,0);
  local_d0 = 0x3a2261227b;
  uStack_cb = 0x31;
  uStack_ca = 0x2220;
  local_c8 = 0x62;
  uStack_c7 = 0x7d313a22;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000d;
  local_c3 = 0;
  local_e0 = (error_category *)&local_d0;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_f0,0xd);
  local_f0._M_cat = (error_category *)&local_d0;
  ppVar2 = pstore::json::parser<pstore::json::null_output>::input<pstore::gsl::span<char_const,_1l>>
                     (&local_c0,(span<const_char,__1L> *)&local_f0);
  pstore::json::parser<pstore::json::null_output>::eof(ppVar2);
  if (local_e0 != (error_category *)&local_d0) {
    operator_delete(local_e0,CONCAT26(uStack_ca,CONCAT15(uStack_cb,local_d0)) + 1);
  }
  local_f0._M_cat = pstore::json::get_error_category();
  local_f0._M_value = 7;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_e0,"p2.last_error ()",
             "make_error_code (json::error_code::expected_object_member)",&local_c0.error_,&local_f0
            );
  if (local_e0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((long *)local_f0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0._0_8_ + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  local_f0._M_value = local_c0.coordinate_.column;
  local_f0._4_4_ = local_c0.coordinate_.row;
  local_f8.column = 8;
  local_f8.row = 1;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)&local_e0,"p2.coordinate ()","(json::coord{8U, 1U})",(coord *)&local_f0,
             &local_f8);
  if (local_e0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((coord)local_f0._0_8_ != (coord)0x0) {
      (**(code **)(*(long *)local_f0._0_8_ + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.string_._M_dataplus._M_p,
                    local_c0.string_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
  ::~deque(&local_c0.stack_.c);
  if (local_c0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
       )0x0) {
    operator_delete((void *)local_c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
                            ._M_head_impl,0x68);
  }
  pstore::json::parser<pstore::json::null_output>::parser(&local_c0,0);
  local_d0 = 0x3a2261227b;
  uStack_cb = 0x31;
  uStack_ca = 0x2c2c;
  local_c8 = 0x22;
  uStack_c7 = 0x313a2262;
  local_c3 = 0x7d;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000e;
  local_c2 = 0;
  local_e0 = (error_category *)&local_d0;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_f0,0xe);
  local_f0._M_cat = (error_category *)&local_d0;
  ppVar2 = pstore::json::parser<pstore::json::null_output>::input<pstore::gsl::span<char_const,_1l>>
                     (&local_c0,(span<const_char,__1L> *)&local_f0);
  pstore::json::parser<pstore::json::null_output>::eof(ppVar2);
  if (local_e0 != (error_category *)&local_d0) {
    operator_delete(local_e0,CONCAT26(uStack_ca,CONCAT15(uStack_cb,local_d0)) + 1);
  }
  local_f0._M_cat = pstore::json::get_error_category();
  local_f0._M_value = 8;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_e0,"p3.last_error ()",
             "make_error_code (json::error_code::expected_token)",&local_c0.error_,&local_f0);
  if (local_e0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((long *)local_f0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0._0_8_ + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  local_f0._M_value = local_c0.coordinate_.column;
  local_f0._4_4_ = local_c0.coordinate_.row;
  local_f8.column = 8;
  local_f8.row = 1;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)&local_e0,"p3.coordinate ()","(json::coord{8U, 1U})",(coord *)&local_f0,
             &local_f8);
  if (local_e0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0x9d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((coord)local_f0._0_8_ != (coord)0x0) {
      (**(code **)(*(long *)local_f0._0_8_ + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.string_._M_dataplus._M_p,
                    local_c0.string_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
  ::~deque(&local_c0.stack_.c);
  if ((_Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
       )local_c0.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
        ._M_head_impl != (singleton_storage<pstore::json::null_output> *)0x0) {
    operator_delete((void *)local_c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonObject, MisplacedComma) {
    {
        // An object with a trailing comma but with the extension disabled.
        json::parser<json::null_output> p1;
        p1.input (R"({"a":1,})"s).eof ();
        EXPECT_EQ (p1.last_error (), make_error_code (json::error_code::expected_token));
        EXPECT_EQ (p1.coordinate (), (json::coord{8U, 1U}));
    }
    {
        json::parser<json::null_output> p2;
        p2.input (R"({"a":1 "b":1})"s).eof ();
        EXPECT_EQ (p2.last_error (), make_error_code (json::error_code::expected_object_member));
        EXPECT_EQ (p2.coordinate (), (json::coord{8U, 1U}));
    }
    {
        json::parser<json::null_output> p3;
        p3.input (R"({"a":1,,"b":1})"s).eof ();
        EXPECT_EQ (p3.last_error (), make_error_code (json::error_code::expected_token));
        EXPECT_EQ (p3.coordinate (), (json::coord{8U, 1U}));
    }
}